

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

int __thiscall
CVmObjGramProd::getp_clearAlts(CVmObjGramProd *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_val_t *pvVar2;
  vm_gram_ext *pvVar3;
  int *in_RCX;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  vm_val_t *in_RDI;
  CVmObjGramProd *unaff_retaddr;
  size_t i;
  vm_obj_id_t dict;
  int argc;
  vm_val_t *v;
  CVmNativeCodeDesc *in_stack_ffffffffffffff98;
  ulong uVar4;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar5;
  int iVar6;
  ulong local_50;
  vm_obj_id_t in_stack_fffffffffffffff8;
  vm_obj_id_t in_stack_fffffffffffffffc;
  
  if (in_RCX == (int *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = *in_RCX;
  }
  iVar6 = iVar5;
  if ((getp_clearAlts(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_clearAlts(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_clearAlts::desc,0,1);
    __cxa_guard_release(&getp_clearAlts(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_RDI,(uint *)CONCAT44(iVar6,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
  if (iVar1 == 0) {
    if (((0 < iVar5) && (pvVar2 = CVmStack::get(0), pvVar2->typ != VM_NIL)) &&
       ((pvVar2->typ != VM_OBJ || (iVar1 = CVmObjDict::is_dictionary_obj(0), iVar1 == 0)))) {
      err_throw(0);
    }
    local_50 = 0;
    while (uVar4 = local_50, pvVar3 = get_ext((CVmObjGramProd *)in_RDI), uVar4 < pvVar3->alt_cnt_) {
      pvVar3 = get_ext((CVmObjGramProd *)in_RDI);
      pvVar3->alts_[local_50]->del = 1;
      local_50 = local_50 + 1;
    }
    CVmRun::push_obj((CVmRun *)CONCAT44(iVar6,in_stack_ffffffffffffffa0),
                     (vm_obj_id_t)(uVar4 >> 0x20));
    delete_marked_alts(unaff_retaddr,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8);
    vm_val_t::set_obj(in_RDX,in_ESI);
    CVmStack::discard(iVar5 + 1);
  }
  return 1;
}

Assistant:

int CVmObjGramProd::getp_clearAlts(VMG_ vm_obj_id_t self,
                                   vm_val_t *retval, uint *oargc)
{
    const vm_val_t *v;

    /* check arguments */
    int argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the dictionary object, if specified */
    vm_obj_id_t dict = VM_INVALID_OBJ;
    if (argc >= 1
        && (v = G_stk->get(0))->typ != VM_NIL
        && (v->typ != VM_OBJ
            || !CVmObjDict::is_dictionary_obj(vmg_ dict = v->val.obj)))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* mark every alternative for deletion */
    for (size_t i = 0 ; i < get_ext()->alt_cnt_ ; ++i)
        get_ext()->alts_[i]->del = TRUE;

    /* save 'self' for gc protection */
    G_interpreter->push_obj(vmg_ self);

    /* delete the batch */
    delete_marked_alts(vmg_ self, dict);

    /* return self */
    retval->set_obj(self);

    /* discard arguments and gc protection */
    G_stk->discard(argc + 1);

    /* handled */
    return TRUE;
}